

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool art_node_init_iterator(art_ref_t ref,art_iterator_t *iterator,_Bool first)

{
  undefined4 *puVar1;
  byte bVar2;
  unkbyte9 Var3;
  int iVar4;
  art_node_t *node;
  art_typecode_t typecode;
  art_indexed_child_t aVar6;
  ulong uVar5;
  
  uVar5 = ref & 0xff;
  iVar4 = (int)uVar5;
  while (uVar5 != 1) {
    node = (art_node_t *)((ref >> 0x10) * ART_NODE_SIZES[uVar5] + (long)iterator->art->nodes[uVar5])
    ;
    if (first) {
      aVar6 = art_node_next_child(node,(art_typecode_t)ref,-1);
      Var3 = aVar6._0_9_;
    }
    else {
      aVar6 = art_node_prev_child(node,(art_typecode_t)ref,0x100);
      Var3 = aVar6._0_9_;
    }
    art_iterator_down(iterator,ref,(uint8_t)((unkuint9)Var3 >> 0x40));
    uVar5 = (ulong)Var3 & 0xff;
    iVar4 = (int)uVar5;
    ref = (ulong)Var3;
  }
  bVar2 = iterator->frame;
  iterator->frames[bVar2].ref = ref;
  iterator->frames[bVar2].index_in_node = '\0';
  puVar1 = (undefined4 *)
           (*(long *)((long)iterator->art->nodes + (ulong)(uint)(iVar4 << 3)) +
           (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar4 << 3)));
  *(undefined4 *)iterator->key = *puVar1;
  *(undefined2 *)(iterator->key + 4) = *(undefined2 *)(puVar1 + 1);
  iterator->value = (art_val_t *)(puVar1 + 2);
  return SUB81(puVar1 + 2,0);
}

Assistant:

static bool art_node_init_iterator(art_ref_t ref, art_iterator_t *iterator,
                                   bool first) {
    while (!art_is_leaf(ref)) {
        art_node_t *node = art_deref(iterator->art, ref);
        art_indexed_child_t indexed_child;
        if (first) {
            indexed_child =
                art_node_next_child(node, art_ref_typecode(ref), -1);
        } else {
            indexed_child =
                art_node_prev_child(node, art_ref_typecode(ref), 256);
        }
        art_iterator_down(iterator, ref, indexed_child.index);
        ref = indexed_child.child;
    }
    // We're at a leaf.
    iterator->frames[iterator->frame].ref = ref;
    iterator->frames[iterator->frame].index_in_node = 0;  // Should not matter.
    return art_iterator_valid_loc(iterator, ref);
}